

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O0

void ym2612_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  uint uVar1;
  int iVar2;
  FM_OPN2 *OPN_00;
  uint *puVar3;
  FM_CH *CH;
  FM_CH *CH_00;
  FM_CH *CH_01;
  FM_CH *CH_02;
  FM_CH *CH_03;
  FM_CH *CH_04;
  int local_90;
  int local_8c;
  INT32 rt;
  INT32 lt;
  FM_CH *cch [6];
  DEV_SMPL *pDStack_50;
  INT32 dacout;
  DEV_SMPL *bufR;
  DEV_SMPL *bufL;
  UINT32 i;
  INT32 *out_fm;
  FM_OPN2 *OPN;
  YM2612 *F2612;
  DEV_SMPL **buffer_local;
  UINT32 length_local;
  void *chip_local;
  
  OPN_00 = (FM_OPN2 *)((long)chip + 0x208);
  puVar3 = (uint *)((long)chip + 0x46fc);
  if (buffer == (DEV_SMPL **)0x0) {
    pDStack_50 = (DEV_SMPL *)0x0;
    bufR = (DEV_SMPL *)0x0;
  }
  else {
    bufR = *buffer;
    pDStack_50 = buffer[1];
  }
  CH = (FM_CH *)((long)chip + 0x4718);
  CH_00 = (FM_CH *)((long)chip + 0x48b0);
  CH_01 = (FM_CH *)((long)chip + 0x4a48);
  CH_02 = (FM_CH *)((long)chip + 0x4be0);
  CH_03 = (FM_CH *)((long)chip + 0x4d78);
  CH_04 = (FM_CH *)((long)chip + 0x4f10);
  if (*(char *)((long)chip + 0x50b0) == '\0') {
    cch[5]._4_4_ = *(int *)((long)chip + 0x50ac) << 5;
  }
  else {
    cch[5]._4_4_ = 0;
  }
  refresh_fc_eg_chan(OPN_00,CH);
  refresh_fc_eg_chan(OPN_00,CH_00);
  if ((*(uint *)((long)chip + 0x234) & 0xc0) == 0) {
    refresh_fc_eg_chan(OPN_00,CH_01);
  }
  else if (*(int *)((long)chip + 0x4a70) == -1) {
    refresh_fc_eg_slot(OPN_00,(FM_SLOT *)CH_01,*(int *)((long)chip + 0x66c),
                       (uint)*(byte *)((long)chip + 0x676));
    refresh_fc_eg_slot(OPN_00,(FM_SLOT *)((long)chip + 0x4ae8),*(int *)((long)chip + 0x670),
                       (uint)*(byte *)((long)chip + 0x677));
    refresh_fc_eg_slot(OPN_00,(FM_SLOT *)((long)chip + 0x4a98),*(int *)((long)chip + 0x668),
                       (uint)*(byte *)((long)chip + 0x675));
    refresh_fc_eg_slot(OPN_00,(FM_SLOT *)((long)chip + 0x4b38),*(int *)((long)chip + 0x4bcc),
                       (uint)*(byte *)((long)chip + 0x4bd0));
  }
  refresh_fc_eg_chan(OPN_00,CH_02);
  refresh_fc_eg_chan(OPN_00,CH_03);
  refresh_fc_eg_chan(OPN_00,CH_04);
  if (length == 0) {
    update_ssg_eg_channel((FM_SLOT *)CH);
    update_ssg_eg_channel((FM_SLOT *)CH_00);
    update_ssg_eg_channel((FM_SLOT *)CH_01);
    update_ssg_eg_channel((FM_SLOT *)CH_02);
    update_ssg_eg_channel((FM_SLOT *)CH_03);
    update_ssg_eg_channel((FM_SLOT *)CH_04);
  }
  for (bufL._4_4_ = 0; bufL._4_4_ < length; bufL._4_4_ = bufL._4_4_ + 1) {
    *puVar3 = 0;
    *(undefined4 *)((long)chip + 0x4700) = 0;
    *(undefined4 *)((long)chip + 0x4704) = 0;
    *(undefined4 *)((long)chip + 0x4708) = 0;
    *(undefined4 *)((long)chip + 0x470c) = 0;
    *(undefined4 *)((long)chip + 0x4710) = 0;
    update_ssg_eg_channel((FM_SLOT *)CH);
    update_ssg_eg_channel((FM_SLOT *)CH_00);
    update_ssg_eg_channel((FM_SLOT *)CH_01);
    update_ssg_eg_channel((FM_SLOT *)CH_02);
    update_ssg_eg_channel((FM_SLOT *)CH_03);
    update_ssg_eg_channel((FM_SLOT *)CH_04);
    if (*(char *)((long)chip + 0x50aa) == '\0') {
      chan_calc((YM2612 *)chip,OPN_00,CH);
      chan_calc((YM2612 *)chip,OPN_00,CH_00);
      chan_calc((YM2612 *)chip,OPN_00,CH_01);
      chan_calc((YM2612 *)chip,OPN_00,CH_02);
      chan_calc((YM2612 *)chip,OPN_00,CH_03);
      if (*(char *)((long)chip + 0x50a9) == '\0') {
        chan_calc((YM2612 *)chip,OPN_00,CH_04);
      }
      else {
        **(int **)((long)chip + 0x5078) = cch[5]._4_4_ + **(int **)((long)chip + 0x5078);
      }
    }
    else {
      *(uint *)((long)chip + 0x4700) = cch[5]._4_4_;
      *puVar3 = cch[5]._4_4_;
      *(uint *)((long)chip + 0x4708) = cch[5]._4_4_;
      *(uint *)((long)chip + 0x4704) = cch[5]._4_4_;
      *(uint *)((long)chip + 0x4710) = cch[5]._4_4_;
    }
    advance_lfo(OPN_00);
    *(int *)((long)chip + 0x6c4) = *(int *)((long)chip + 0x6c8) + *(int *)((long)chip + 0x6c4);
    while (*(uint *)((long)chip + 0x6cc) <= *(uint *)((long)chip + 0x6c4)) {
      *(int *)((long)chip + 0x6c4) = *(int *)((long)chip + 0x6c4) - *(int *)((long)chip + 0x6cc);
      *(int *)((long)chip + 0x6c0) = *(int *)((long)chip + 0x6c0) + 1;
      advance_eg_channel(OPN_00,(FM_SLOT *)CH);
      advance_eg_channel(OPN_00,(FM_SLOT *)CH_00);
      advance_eg_channel(OPN_00,(FM_SLOT *)CH_01);
      advance_eg_channel(OPN_00,(FM_SLOT *)CH_02);
      advance_eg_channel(OPN_00,(FM_SLOT *)CH_03);
      advance_eg_channel(OPN_00,(FM_SLOT *)CH_04);
    }
    if ((int)*puVar3 < 0x2001) {
      if ((int)*puVar3 < -0x2000) {
        *puVar3 = 0xffffe000;
      }
    }
    else {
      *puVar3 = 0x2000;
    }
    if (*(int *)((long)chip + 0x4700) < 0x2001) {
      if (*(int *)((long)chip + 0x4700) < -0x2000) {
        *(undefined4 *)((long)chip + 0x4700) = 0xffffe000;
      }
    }
    else {
      *(undefined4 *)((long)chip + 0x4700) = 0x2000;
    }
    if (*(int *)((long)chip + 0x4704) < 0x2001) {
      if (*(int *)((long)chip + 0x4704) < -0x2000) {
        *(undefined4 *)((long)chip + 0x4704) = 0xffffe000;
      }
    }
    else {
      *(undefined4 *)((long)chip + 0x4704) = 0x2000;
    }
    if (*(int *)((long)chip + 0x4708) < 0x2001) {
      if (*(int *)((long)chip + 0x4708) < -0x2000) {
        *(undefined4 *)((long)chip + 0x4708) = 0xffffe000;
      }
    }
    else {
      *(undefined4 *)((long)chip + 0x4708) = 0x2000;
    }
    if (*(int *)((long)chip + 0x470c) < 0x2001) {
      if (*(int *)((long)chip + 0x470c) < -0x2000) {
        *(undefined4 *)((long)chip + 0x470c) = 0xffffe000;
      }
    }
    else {
      *(undefined4 *)((long)chip + 0x470c) = 0x2000;
    }
    if (*(int *)((long)chip + 0x4710) < 0x2001) {
      if (*(int *)((long)chip + 0x4710) < -0x2000) {
        *(undefined4 *)((long)chip + 0x4710) = 0xffffe000;
      }
    }
    else {
      *(undefined4 *)((long)chip + 0x4710) = 0x2000;
    }
    local_90 = (*(uint *)((long)chip + 0x4708) & *(uint *)((long)chip + 0x6ac)) +
               (*(uint *)((long)chip + 0x4704) & *(uint *)((long)chip + 0x6a4)) +
               (*(uint *)((long)chip + 0x4700) & *(uint *)((long)chip + 0x69c)) +
               (*puVar3 & *(uint *)((long)chip + 0x694));
    if (*(char *)((long)chip + 0x50aa) == '\0') {
      uVar1 = *(uint *)((long)chip + 0x470c) & *(uint *)((long)chip + 0x6b0);
      local_90 = (*(uint *)((long)chip + 0x470c) & *(uint *)((long)chip + 0x6b4)) + local_90;
    }
    else {
      uVar1 = cch[5]._4_4_ * 2;
    }
    local_8c = uVar1 + (*(uint *)((long)chip + 0x4708) & *(uint *)((long)chip + 0x6a8)) +
                       (*(uint *)((long)chip + 0x4704) & *(uint *)((long)chip + 0x6a0)) +
                       (*(uint *)((long)chip + 0x4700) & *(uint *)((long)chip + 0x698)) +
                       (*puVar3 & *(uint *)((long)chip + 0x690));
    local_8c = (*(uint *)((long)chip + 0x4710) & *(uint *)((long)chip + 0x6b8)) + local_8c;
    local_90 = (*(uint *)((long)chip + 0x4710) & *(uint *)((long)chip + 0x6bc)) + local_90;
    if (*(char *)((long)chip + 0x50b1) == '\0') {
      *(int *)((long)chip + 0x50b4) = local_8c;
      *(int *)((long)chip + 0x50b8) = local_90;
    }
    else {
      if ((*(byte *)((long)chip + 0x50b1) & 1) != 0) {
        *(int *)((long)chip + 0x50b4) = local_8c;
      }
      if ((*(byte *)((long)chip + 0x50b1) & 2) != 0) {
        *(int *)((long)chip + 0x50b8) = local_90;
      }
      *(byte *)((long)chip + 0x50b1) = *(byte *)((long)chip + 0x50b1) ^ 3;
    }
    bufR[bufL._4_4_] = *(DEV_SMPL *)((long)chip + 0x50b4);
    pDStack_50[bufL._4_4_] = *(DEV_SMPL *)((long)chip + 0x50b8);
    *(char *)((long)chip + 0x684) = *(char *)((long)chip + 0x684) << 1;
    if ((((*(int *)((long)chip + 0x240) != 0) && (*(long *)((long)chip + 0x650) == 0)) &&
        (iVar2 = *(int *)((long)chip + 0x240) - (int)(*(double *)((long)chip + 0x218) * 4096.0),
        *(int *)((long)chip + 0x240) = iVar2, iVar2 < 1)) &&
       (TimerAOver((FM_ST2 *)((long)chip + 0x210)), (*(uint *)((long)chip + 0x234) & 0x80) != 0)) {
      CSMKeyControll(OPN_00,CH_01);
    }
    if ((*(byte *)((long)chip + 0x684) & 2) != 0) {
      FM_KEYOFF_CSM(CH_01,0);
      FM_KEYOFF_CSM(CH_01,2);
      FM_KEYOFF_CSM(CH_01,1);
      FM_KEYOFF_CSM(CH_01,3);
      *(undefined1 *)((long)chip + 0x684) = 0;
    }
  }
  if (((*(int *)((long)chip + 0x248) != 0) && (*(long *)((long)chip + 0x650) == 0)) &&
     (iVar2 = *(int *)((long)chip + 0x248) -
              (int)(*(double *)((long)chip + 0x218) * 4096.0 * (double)length),
     *(int *)((long)chip + 0x248) = iVar2, iVar2 < 1)) {
    TimerBOver((FM_ST2 *)((long)chip + 0x210));
  }
  return;
}

Assistant:

void ym2612_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	YM2612 *F2612 = (YM2612 *)chip;
	FM_OPN2 *OPN  = &F2612->OPN;
	INT32 *out_fm = OPN->out_fm;
	UINT32 i;
	DEV_SMPL  *bufL,*bufR;
	INT32 dacout;
	FM_CH   *cch[6];
	INT32 lt,rt;

	/* set buffer */
	if (buffer != NULL)
	{
		bufL = buffer[0];
		bufR = buffer[1];
	}
	else
	{
		// for internal 0-sample update
		bufL = bufR = NULL;
	}

	cch[0]   = &F2612->CH[0];
	cch[1]   = &F2612->CH[1];
	cch[2]   = &F2612->CH[2];
	cch[3]   = &F2612->CH[3];
	cch[4]   = &F2612->CH[4];
	cch[5]   = &F2612->CH[5];
	
	if (! F2612->MuteDAC)
		dacout = F2612->dacout << 5;    /* level unknown */
	else
		dacout = 0;

	/* refresh PG and EG */
	refresh_fc_eg_chan( OPN, cch[0] );
	refresh_fc_eg_chan( OPN, cch[1] );
	if( (OPN->ST.mode & 0xc0) )
	{
		/* 3SLOT MODE */
		if( cch[2]->SLOT[SLOT1].Incr==-1)
		{
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT1] , OPN->SL3.fc[1] , OPN->SL3.kcode[1] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT2] , OPN->SL3.fc[2] , OPN->SL3.kcode[2] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT3] , OPN->SL3.fc[0] , OPN->SL3.kcode[0] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT4] , cch[2]->fc , cch[2]->kcode );
		}
	}else refresh_fc_eg_chan( OPN, cch[2] );
	refresh_fc_eg_chan( OPN, cch[3] );
	refresh_fc_eg_chan( OPN, cch[4] );
	refresh_fc_eg_chan( OPN, cch[5] );
	if (! length)
	{
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);
	}


	/* buffering */
	for(i=0; i < length ; i++)
	{
		/* clear outputs */
		out_fm[0] = 0;
		out_fm[1] = 0;
		out_fm[2] = 0;
		out_fm[3] = 0;
		out_fm[4] = 0;
		out_fm[5] = 0;

		/* update SSG-EG output */
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);

		/* calculate FM */
		if (! F2612->dac_test)
		{
			chan_calc(F2612, OPN, cch[0]);
			chan_calc(F2612, OPN, cch[1]);
			chan_calc(F2612, OPN, cch[2]);
			chan_calc(F2612, OPN, cch[3]);
			chan_calc(F2612, OPN, cch[4]);
			if( F2612->dacen )
				*cch[5]->connect4 += dacout;
			else
				chan_calc(F2612, OPN, cch[5]);
		}
		else
		{
			out_fm[0] = out_fm[1] = dacout;
			out_fm[2] = out_fm[3] = dacout;
			out_fm[5] = dacout;
		}

		/* advance LFO */
		advance_lfo(OPN);

		/* advance envelope generator */
		OPN->eg_timer += OPN->eg_timer_add;
		while (OPN->eg_timer >= OPN->eg_timer_overflow)
		{
			OPN->eg_timer -= OPN->eg_timer_overflow;
			OPN->eg_cnt++;

			advance_eg_channel(OPN, &cch[0]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[1]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[2]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[3]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[4]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[5]->SLOT[SLOT1]);
		}

		if (out_fm[0] > 8192) out_fm[0] = 8192;
		else if (out_fm[0] < -8192) out_fm[0] = -8192;
		if (out_fm[1] > 8192) out_fm[1] = 8192;
		else if (out_fm[1] < -8192) out_fm[1] = -8192;
		if (out_fm[2] > 8192) out_fm[2] = 8192;
		else if (out_fm[2] < -8192) out_fm[2] = -8192;
		if (out_fm[3] > 8192) out_fm[3] = 8192;
		else if (out_fm[3] < -8192) out_fm[3] = -8192;
		if (out_fm[4] > 8192) out_fm[4] = 8192;
		else if (out_fm[4] < -8192) out_fm[4] = -8192;
		if (out_fm[5] > 8192) out_fm[5] = 8192;
		else if (out_fm[5] < -8192) out_fm[5] = -8192;

		/* 6-channels mixing  */
		lt  = ((out_fm[0]>>0) & OPN->pan[0]);
		rt  = ((out_fm[0]>>0) & OPN->pan[1]);
		lt += ((out_fm[1]>>0) & OPN->pan[2]);
		rt += ((out_fm[1]>>0) & OPN->pan[3]);
		lt += ((out_fm[2]>>0) & OPN->pan[4]);
		rt += ((out_fm[2]>>0) & OPN->pan[5]);
		lt += ((out_fm[3]>>0) & OPN->pan[6]);
		rt += ((out_fm[3]>>0) & OPN->pan[7]);
		if (! F2612->dac_test)
		{
			lt += ((out_fm[4]>>0) & OPN->pan[8]);
			rt += ((out_fm[4]>>0) & OPN->pan[9]);
		}
		else
		{
			// DAC test mode ignores panning for channel 4
			lt += dacout;
			lt += dacout;
		}
		lt += ((out_fm[5]>>0) & OPN->pan[10]);
		rt += ((out_fm[5]>>0) & OPN->pan[11]);

		/* buffering */
		if (F2612->WaveOutMode)
		{
			if (F2612->WaveOutMode & 0x01)
				F2612->WaveL = lt;
			if (F2612->WaveOutMode & 0x02)
				F2612->WaveR = rt;
			F2612->WaveOutMode ^= 0x03;
		}
		else
		{
			F2612->WaveL = lt;
			F2612->WaveR = rt;
		}
		bufL[i] = F2612->WaveL;
		bufR[i] = F2612->WaveR;

		/* CSM mode: if CSM Key ON has occured, CSM Key OFF need to be sent       */
		/* only if Timer A does not overflow again (i.e CSM Key ON not set again) */
		OPN->SL3.key_csm <<= 1;

		/* timer A control */
		//INTERNAL_TIMER_A( &OPN->ST , cch[2] )
		{
			if( OPN->ST.TAC && (OPN->ST.timer_handler==0) )
				if( (OPN->ST.TAC -= (int)(OPN->ST.freqbase*4096)) <= 0 )
				{
					TimerAOver( &OPN->ST );
					// CSM mode total level latch and auto key on
					if( OPN->ST.mode & 0x80 )
						CSMKeyControll( OPN, cch[2] );
				}
		}

		/* CSM Mode Key ON still disabled */
		if (OPN->SL3.key_csm & 2)
		{
			/* CSM Mode Key OFF (verified by Nemesis on real hardware) */
			FM_KEYOFF_CSM(cch[2],SLOT1);
			FM_KEYOFF_CSM(cch[2],SLOT2);
			FM_KEYOFF_CSM(cch[2],SLOT3);
			FM_KEYOFF_CSM(cch[2],SLOT4);
			OPN->SL3.key_csm = 0;
		}
	}

	/* timer B control */
	INTERNAL_TIMER_B(&OPN->ST,length)
}